

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_double_var(secp256k1_gej *r,secp256k1_gej *a,secp256k1_fe *rzr)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  secp256k1_fe t3;
  secp256k1_fe t2;
  secp256k1_fe t1;
  secp256k1_fe local_d0;
  secp256k1_fe local_a8;
  secp256k1_fe local_80;
  secp256k1_fe local_58;
  
  if (a->infinity == 0) {
    r->infinity = 0;
    secp256k1_fe_mul(&r->z,&a->z,&a->y);
    (r->z).n[0] = (r->z).n[0] << 1;
    puVar1 = (r->z).n + 1;
    *puVar1 = *puVar1 << 1;
    puVar1 = (r->z).n + 2;
    *puVar1 = *puVar1 << 1;
    puVar1 = (r->z).n + 3;
    *puVar1 = *puVar1 << 1;
    puVar1 = (r->z).n + 4;
    *puVar1 = *puVar1 << 1;
    secp256k1_fe_sqr(&local_58,&a->x);
    local_58.n[0] = local_58.n[0] * 3;
    local_58.n[1] = local_58.n[1] * 3;
    local_58.n[2] = local_58.n[2] * 3;
    local_58.n[3] = local_58.n[3] * 3;
    local_58.n[4] = local_58.n[4] * 3;
    secp256k1_fe_sqr(&local_80,&local_58);
    secp256k1_fe_sqr(&local_a8,&a->y);
    local_a8.n[0] = local_a8.n[0] << 1;
    local_a8.n[1] = local_a8.n[1] << 1;
    local_a8.n[2] = local_a8.n[2] << 1;
    local_a8.n[3] = local_a8.n[3] << 1;
    local_a8.n[4] = local_a8.n[4] << 1;
    secp256k1_fe_sqr(&local_d0,&local_a8);
    uVar6 = local_d0.n[4];
    uVar5 = local_d0.n[3];
    uVar4 = local_d0.n[2];
    uVar3 = local_d0.n[1];
    uVar2 = local_d0.n[0];
    local_d0.n[0] = local_d0.n[0] * 2;
    local_d0.n[1] = local_d0.n[1] * 2;
    local_d0.n[2] = local_d0.n[2] * 2;
    local_d0.n[3] = local_d0.n[3] * 2;
    local_d0.n[4] = local_d0.n[4] * 2;
    secp256k1_fe_mul(&local_a8,&local_a8,&a->x);
    (r->x).n[0] = local_a8.n[0];
    (r->x).n[1] = local_a8.n[1];
    (r->x).n[2] = local_a8.n[2];
    (r->x).n[3] = local_a8.n[3];
    (r->x).n[4] = local_a8.n[4];
    uVar7 = (r->x).n[1];
    uVar8 = (r->x).n[2];
    uVar9 = (r->x).n[3];
    uVar10 = (r->x).n[0] * -4 + 0x9ffff5ffffd9d6;
    (r->x).n[0] = uVar10;
    uVar11 = uVar7 * -4 + 0x9ffffffffffff6;
    (r->x).n[1] = uVar11;
    uVar8 = uVar8 * -4 + 0x9ffffffffffff6;
    (r->x).n[2] = uVar8;
    uVar7 = uVar9 * -4 + 0x9ffffffffffff6;
    (r->x).n[3] = uVar7;
    uVar9 = local_a8.n[4] * -4 + 0x9fffffffffff6;
    (r->x).n[4] = uVar9;
    (r->x).n[0] = uVar10 + local_80.n[0];
    (r->x).n[1] = uVar11 + local_80.n[1];
    (r->x).n[2] = uVar8 + local_80.n[2];
    (r->x).n[3] = uVar7 + local_80.n[3];
    (r->x).n[4] = uVar9 + local_80.n[4];
    local_80.n[0] = 0x3ffffbfffff0bc - local_80.n[0];
    local_80.n[1] = 0x3ffffffffffffc - local_80.n[1];
    local_80.n[2] = 0x3ffffffffffffc - local_80.n[2];
    local_80.n[3] = 0x3ffffffffffffc - local_80.n[3];
    local_80.n[4] = 0x3fffffffffffc - local_80.n[4];
    local_a8.n[0] = local_80.n[0] + local_a8.n[0] * 6;
    local_a8.n[1] = local_80.n[1] + local_a8.n[1] * 6;
    local_a8.n[2] = local_80.n[2] + local_a8.n[2] * 6;
    local_a8.n[3] = local_80.n[3] + local_a8.n[3] * 6;
    local_a8.n[4] = local_80.n[4] + local_a8.n[4] * 6;
    secp256k1_fe_mul(&r->y,&local_58,&local_a8);
    (r->y).n[0] = (r->y).n[0] + uVar2 * -2 + 0x5ffff9ffffe91a;
    puVar1 = (r->y).n + 1;
    *puVar1 = *puVar1 + uVar3 * -2 + 0x5ffffffffffffa;
    puVar1 = (r->y).n + 2;
    *puVar1 = *puVar1 + uVar4 * -2 + 0x5ffffffffffffa;
    puVar1 = (r->y).n + 3;
    *puVar1 = *puVar1 + uVar5 * -2 + 0x5ffffffffffffa;
    puVar1 = (r->y).n + 4;
    *puVar1 = *puVar1 + uVar6 * -2 + 0x5fffffffffffa;
  }
  else {
    r->infinity = 1;
  }
  return;
}

Assistant:

static void secp256k1_gej_double_var(secp256k1_gej *r, const secp256k1_gej *a, secp256k1_fe *rzr) {
    /** For secp256k1, 2Q is infinity if and only if Q is infinity. This is because if 2Q = infinity,
     *  Q must equal -Q, or that Q.y == -(Q.y), or Q.y is 0. For a point on y^2 = x^3 + 7 to have
     *  y=0, x^3 must be -7 mod p. However, -7 has no cube root mod p.
     *
     *  Having said this, if this function receives a point on a sextic twist, e.g. by
     *  a fault attack, it is possible for y to be 0. This happens for y^2 = x^3 + 6,
     *  since -6 does have a cube root mod p. For this point, this function will not set
     *  the infinity flag even though the point doubles to infinity, and the result
     *  point will be gibberish (z = 0 but infinity = 0).
     */
    if (a->infinity) {
        r->infinity = 1;
        if (rzr != NULL) {
            secp256k1_fe_set_int(rzr, 1);
        }
        return;
    }

    if (rzr != NULL) {
        *rzr = a->y;
        secp256k1_fe_normalize_weak(rzr);
        secp256k1_fe_mul_int(rzr, 2);
    }

    secp256k1_gej_double(r, a);
}